

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall
capnp::compiler::Compiler::Node::traverseDependency
          (Node *this,uint64_t depId,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo,bool ignoreIfNotFound)

{
  Impl *id;
  Fault local_60;
  Fault f;
  Node *node;
  Node *local_48;
  Node *_node841;
  ChunkHeader *pCStack_38;
  bool ignoreIfNotFound_local;
  Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo_local;
  SchemaLoader *finalLoader_local;
  unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
  *seen_local;
  uint64_t uStack_18;
  uint eagerness_local;
  uint64_t depId_local;
  Node *this_local;
  
  _node841._7_1_ = ignoreIfNotFound;
  pCStack_38 = (ChunkHeader *)sourceInfo;
  sourceInfo_local = (Vector<capnp::schema::Node::SourceInfo::Reader> *)finalLoader;
  finalLoader_local = (SchemaLoader *)seen;
  seen_local._4_4_ = eagerness;
  uStack_18 = depId;
  depId_local = (uint64_t)this;
  id = CompiledModule::getCompiler(this->module);
  Compiler::Impl::findNode((Impl *)&node,(uint64_t)id);
  f.exception = (Exception *)
                kj::_::readMaybe<capnp::compiler::Compiler::Node>
                          ((Maybe<capnp::compiler::Compiler::Node_&> *)&node);
  local_48 = (Node *)f.exception;
  if ((Node *)f.exception == (Node *)0x0) {
    if ((_node841._7_1_ & 1) == 0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],unsigned_long&>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                 ,0x34c,FAILED,(char *)0x0,"\"Dependency ID not present in compiler?\", depId",
                 (char (*) [39])"Dependency ID not present in compiler?",&stack0xffffffffffffffe8);
      kj::_::Debug::Fault::fatal(&local_60);
    }
  }
  else {
    traverse((Node *)f.exception,seen_local._4_4_,
             (unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
              *)finalLoader_local,(SchemaLoader *)sourceInfo_local,
             (Vector<capnp::schema::Node::SourceInfo::Reader> *)pCStack_38);
  }
  return;
}

Assistant:

void Compiler::Node::traverseDependency(uint64_t depId, uint eagerness,
                                        std::unordered_map<Node*, uint>& seen,
                                        const SchemaLoader& finalLoader,
                                        kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo,
                                        bool ignoreIfNotFound) {
  KJ_IF_SOME(node, module->getCompiler().findNode(depId)) {
    node.traverse(eagerness, seen, finalLoader, sourceInfo);
  } else if (!ignoreIfNotFound) {
    KJ_FAIL_ASSERT("Dependency ID not present in compiler?", depId);
  }
}